

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::Payload<(Protocol::MQTT::Common::ControlPacketType)1>::getFilteredSize
          (Payload<(Protocol::MQTT::Common::ControlPacketType)1> *this)

{
  ushort uVar1;
  WillMessage *pWVar2;
  byte bVar3;
  uint32 uVar4;
  int iVar5;
  int iVar6;
  
  if (this->fixedHeader == (FixedField<(Protocol::MQTT::Common::ControlPacketType)1> *)0x0) {
    uVar4 = 0;
  }
  else {
    bVar3 = (this->fixedHeader->super_ConnectHeaderImpl).field_2.flags;
    iVar5 = 0;
    if ((bVar3 & 4) != 0) {
      pWVar2 = this->willMessage;
      uVar1 = (pWVar2->willProperties).length.size;
      uVar4 = Common::VBInt::operator_cast_to_unsigned_int(&(pWVar2->willProperties).length);
      iVar5 = (uint)(pWVar2->willPayload).length + uVar4 + uVar1 + (uint)(pWVar2->willTopic).length
              + 4;
      bVar3 = (this->fixedHeader->super_ConnectHeaderImpl).field_2.flags;
    }
    iVar6 = 0;
    if ((char)bVar3 < '\0') {
      iVar6 = (this->username).length + 2;
    }
    uVar4 = iVar6 + iVar5;
    if ((bVar3 & 0x40) != 0) {
      uVar4 = uVar4 + (this->password).length + 2;
    }
  }
  return uVar4;
}

Assistant:

uint32 getFilteredSize() const
                {
                    uint32 s = 0;
                    if (!fixedHeader) return s;
                    if (fixedHeader->willFlag)      s += willMessage->getSize();
                    if (fixedHeader->usernameFlag)  s += username.getSize();
                    if (fixedHeader->passwordFlag)  s += password.getSize();
                    return s;
                }